

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesDH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  ushort uVar7;
  size_t sVar8;
  size_t sVar9;
  BrotliEncoderDictionary *pBVar10;
  void *pvVar11;
  uint32_t *puVar12;
  uint32_t *puVar13;
  uint64_t uVar14;
  HasherCommon *pHVar15;
  uint8_t *puVar16;
  BrotliDictionary *pBVar17;
  size_t sVar18;
  size_t sVar19;
  PreparedDictionary *pPVar20;
  void *pvVar21;
  size_t sVar22;
  undefined8 uVar23;
  int iVar24;
  byte bVar25;
  void *pvVar26;
  undefined8 *puVar27;
  void *pvVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  ulong *puVar32;
  char *pcVar33;
  size_t sVar34;
  ulong uVar35;
  void *pvVar36;
  uint32_t uVar37;
  long lVar38;
  uint *puVar39;
  void *pvVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  byte bVar46;
  uint16_t uVar47;
  uint uVar48;
  void *pvVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  ulong uVar53;
  void *pvVar54;
  void *pvVar55;
  long lVar56;
  ulong uVar57;
  ulong *puVar58;
  ulong uVar59;
  size_t i;
  ulong uVar60;
  ulong uVar61;
  int last_distance;
  ulong uVar62;
  void *pvVar63;
  uint8_t *s1_orig_2;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  bool bVar67;
  size_t cur_ix_masked;
  uint32_t *buckets;
  size_t cur_ix_masked_1;
  ulong local_1d8;
  ulong local_1c8;
  ulong local_1a8;
  ulong local_198;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_140;
  void *local_138;
  Command *local_128;
  int local_108;
  uint local_104;
  void *local_100;
  ulong local_d8;
  
  iVar50 = params->lgwin;
  pvVar5 = (void *)((position - 7) + num_bytes);
  pvVar40 = (void *)position;
  if (7 < num_bytes) {
    pvVar40 = pvVar5;
  }
  lVar41 = 0x200;
  if (params->quality < 9) {
    lVar41 = 0x40;
  }
  sVar8 = params->stream_offset;
  uVar44 = *last_insert_len;
  uVar1 = position + num_bytes;
  sVar9 = (params->dictionary).compound.total_size;
  uVar48 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar48) {
    iVar51 = *dist_cache;
    dist_cache[4] = iVar51 + -1;
    dist_cache[5] = iVar51 + 1;
    dist_cache[6] = iVar51 + -2;
    dist_cache[7] = iVar51 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar51 + 3,iVar51 + -3);
    if (10 < uVar48) {
      iVar51 = dist_cache[1];
      dist_cache[10] = iVar51 + -1;
      dist_cache[0xb] = iVar51 + 1;
      dist_cache[0xc] = iVar51 + -2;
      dist_cache[0xd] = iVar51 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar51 + 3,iVar51 + -3);
    }
  }
  pvVar6 = (void *)((1L << ((byte)iVar50 & 0x3f)) - 0x10);
  pvVar49 = (void *)(lVar41 + position);
  lVar56 = sVar9 + 1;
  lVar4 = position - 1;
  local_128 = commands;
LAB_01f3a475:
LAB_01f3a483:
  pvVar28 = (void *)position;
  if (uVar1 <= (long)pvVar28 + 8U) {
    *last_insert_len = (uVar44 + uVar1) - (long)pvVar28;
    *num_commands = *num_commands + ((long)local_128 - (long)commands >> 4);
    return;
  }
  pvVar63 = pvVar6;
  if (pvVar28 < pvVar6) {
    pvVar63 = pvVar28;
  }
  pvVar36 = (void *)(sVar8 + (long)pvVar28);
  if (pvVar6 <= (void *)(sVar8 + (long)pvVar28)) {
    pvVar36 = pvVar6;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_104 = 0;
    local_d8 = 0;
    goto LAB_01f3a53c;
  }
  if (pvVar28 == (void *)0x0) {
    local_d8 = 0;
LAB_01f3a509:
    uVar43 = 0;
  }
  else {
    local_d8 = (ulong)ringbuffer[(long)pvVar28 - 1U & ringbuffer_mask];
    if (pvVar28 == (void *)0x1) goto LAB_01f3a509;
    uVar43 = (ulong)ringbuffer[(long)pvVar28 - 2U & ringbuffer_mask];
  }
  local_104 = (uint)(params->dictionary).contextual.context_map
                    [literal_context_lut[uVar43 + 0x100] | literal_context_lut[local_d8]];
LAB_01f3a53c:
  uVar64 = uVar1 - (long)pvVar28;
  pBVar10 = (params->dictionary).contextual.dict[local_104];
  pvVar11 = (void *)(params->dist).max_distance;
  puVar12 = (hasher->privat)._H5.buckets_;
  puVar13 = (hasher->privat)._H6.buckets_;
  uVar53 = (ulong)pvVar28 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar53);
  uVar57 = 0x7e4;
  pvVar26 = (void *)0x0;
  uVar43 = 0;
  uVar60 = 0;
  uVar62 = 0;
  do {
    if (uVar60 == (long)(hasher->privat)._H6.num_last_distances_to_check_) {
      uVar60 = (hasher->privat)._H5.block_size_;
      uVar14 = (hasher->privat)._H6.hash_mul_;
      uVar31 = *puVar2 * uVar14 >> 0x31;
      lVar42 = uVar31 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar7 = *(ushort *)((long)puVar12 + uVar31 * 2);
      uVar66 = (ulong)uVar7;
      uVar65 = 0;
      if (uVar60 <= uVar66) {
        uVar65 = uVar66 - uVar60;
      }
      uVar48 = (hasher->privat)._H6.block_mask_;
      do {
        uVar35 = uVar62;
        local_1c8 = uVar57;
        uVar45 = uVar43;
        local_138 = pvVar26;
        uVar61 = uVar35 + uVar53;
        do {
          do {
            do {
              uVar52 = (uint)ringbuffer_mask;
              if (uVar66 <= uVar65) {
LAB_01f3a87e:
                puVar13[lVar42 + (ulong)(uVar48 & uVar7)] = (uint32_t)pvVar28;
                *(ushort *)((long)puVar12 + uVar31 * 2) = uVar7 + 1;
                if (local_1c8 != 0x7e4) {
                  iVar50 = 0;
                  goto LAB_01f3ab0d;
                }
                iVar50 = 0;
                pHVar15 = (hasher->privat)._H6.common_;
                uVar43 = pHVar15->dict_num_lookups;
                local_140 = pHVar15->dict_num_matches;
                local_1c8 = 0x7e4;
                if (local_140 < uVar43 >> 7) goto LAB_01f3ab0d;
                uVar57 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                puVar16 = pBVar10->hash_table_lengths;
                iVar50 = 0;
                local_1c8 = 0x7e4;
                lVar42 = 0;
                goto LAB_01f3a946;
              }
              uVar66 = uVar66 - 1;
              pvVar26 = (void *)((long)pvVar28 -
                                (ulong)puVar13[lVar42 + (ulong)((uint)uVar66 & uVar48)]);
              if (pvVar63 < pvVar26) goto LAB_01f3a87e;
            } while (ringbuffer_mask < uVar61);
            uVar57 = (ulong)(puVar13[lVar42 + (ulong)((uint)uVar66 & uVar48)] & uVar52);
            uVar43 = uVar57 + uVar35;
          } while (((ringbuffer_mask < uVar43) || (ringbuffer[uVar61] != ringbuffer[uVar43])) ||
                  (*(int *)(ringbuffer + uVar57) != (int)*puVar2));
          lVar38 = 0;
          uVar43 = uVar64 - 4;
LAB_01f3a800:
          if (uVar43 < 8) {
            for (; ((long)pvVar28 + (lVar38 - uVar1) != -4 &&
                   (ringbuffer[lVar38 + uVar57 + 4] == *(uint8_t *)((long)puVar2 + lVar38 + 4)));
                lVar38 = lVar38 + 1) {
            }
          }
          else {
            uVar62 = *(ulong *)((long)puVar2 + lVar38 + 4);
            if (uVar62 == *(ulong *)(ringbuffer + lVar38 + uVar57 + 4)) goto code_r0x01f3a814;
            uVar62 = *(ulong *)(ringbuffer + lVar38 + uVar57 + 4) ^ uVar62;
            uVar43 = 0;
            if (uVar62 != 0) {
              for (; (uVar62 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
              }
            }
            lVar38 = lVar38 + (uVar43 >> 3 & 0x1fffffff);
          }
          uVar43 = lVar38 + 4;
          iVar50 = 0x1f;
          if ((uint)pvVar26 != 0) {
            for (; (uint)pvVar26 >> iVar50 == 0; iVar50 = iVar50 + -1) {
            }
          }
          uVar57 = (ulong)(iVar50 * -0x1e + 0x780) + uVar43 * 0x87;
          uVar62 = uVar43;
        } while (uVar57 <= local_1c8);
      } while( true );
    }
    pvVar54 = (void *)(long)dist_cache[uVar60];
    if (((pvVar54 <= pvVar63) && ((void *)((long)pvVar28 - (long)pvVar54) < pvVar28)) &&
       (uVar53 + uVar62 <= ringbuffer_mask)) {
      uVar31 = (ulong)((long)pvVar28 - (long)pvVar54) & ringbuffer_mask;
      uVar65 = uVar31 + uVar62;
      if ((uVar65 <= ringbuffer_mask) && (ringbuffer[uVar53 + uVar62] == ringbuffer[uVar65])) {
        puVar32 = (ulong *)(ringbuffer + uVar31);
        lVar42 = 0;
        puVar58 = puVar2;
        uVar65 = uVar64;
LAB_01f3a5ff:
        if (uVar65 < 8) {
          for (uVar31 = 0;
              (uVar65 != uVar31 &&
              (*(char *)((long)puVar32 + uVar31) == *(char *)((long)puVar58 + uVar31)));
              uVar31 = uVar31 + 1) {
          }
          uVar31 = uVar31 - lVar42;
        }
        else {
          if (*puVar58 == *puVar32) goto code_r0x01f3a611;
          uVar31 = *puVar32 ^ *puVar58;
          uVar65 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
            }
          }
          uVar31 = (uVar65 >> 3 & 0x1fffffff) - lVar42;
        }
        if (((2 < uVar31) || ((uVar60 < 2 && (uVar31 == 2)))) &&
           (uVar65 = uVar31 * 0x87 + 0x78f, uVar57 < uVar65)) {
          if (uVar60 != 0) {
            uVar65 = uVar65 - ((0x1ca10U >> ((byte)uVar60 & 0xe) & 0xe) + 0x27);
          }
          if (uVar57 < uVar65) {
            pvVar26 = pvVar54;
            uVar43 = uVar31;
            uVar57 = uVar65;
            uVar62 = uVar31;
          }
        }
      }
    }
    uVar60 = uVar60 + 1;
  } while( true );
LAB_01f3a946:
  if (lVar42 == 2) goto LAB_01f3ab0d;
  uVar43 = uVar43 + 1;
  pHVar15->dict_num_lookups = uVar43;
  bVar29 = puVar16[uVar57];
  uVar62 = (ulong)bVar29;
  if ((uVar62 != 0) && (uVar62 <= uVar64)) {
    pBVar17 = pBVar10->words;
    puVar32 = (ulong *)(pBVar17->data +
                       (ulong)pBVar17->offsets_by_length[uVar62] +
                       pBVar10->hash_table_words[uVar57] * uVar62);
    lVar38 = 0;
    uVar65 = uVar62;
    puVar58 = puVar2;
LAB_01f3a9c6:
    if (uVar65 < 8) {
      for (uVar65 = 0;
          ((bVar29 & 7) != uVar65 &&
          (*(char *)((long)puVar58 + uVar65) == *(char *)((long)puVar32 + uVar65)));
          uVar65 = uVar65 + 1) {
      }
    }
    else {
      if (*puVar32 == *puVar58) goto code_r0x01f3a9d7;
      uVar31 = *puVar58 ^ *puVar32;
      uVar65 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
        }
      }
      uVar65 = uVar65 >> 3 & 0x1fffffff;
    }
    uVar65 = uVar65 - lVar38;
    if (((uVar65 != 0) && (uVar62 < pBVar10->cutoffTransformsCount + uVar65)) &&
       (pvVar26 = (void *)((long)pvVar36 +
                          ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                         ((char)(uVar62 - uVar65) * '\x06' & 0x3fU)) & 0x3f) +
                           (uVar62 - uVar65) * 4 << (pBVar17->size_bits_by_length[uVar62] & 0x3f)) +
                          (ulong)pBVar10->hash_table_words[uVar57] + lVar56), pvVar26 <= pvVar11)) {
      iVar51 = 0x1f;
      if ((uint)pvVar26 != 0) {
        for (; (uint)pvVar26 >> iVar51 == 0; iVar51 = iVar51 + -1) {
        }
      }
      uVar62 = (uVar65 * 0x87 - (ulong)(uint)(iVar51 * 0x1e)) + 0x780;
      if (local_1c8 <= uVar62) {
        iVar50 = (uint)bVar29 - (int)uVar65;
        local_140 = local_140 + 1;
        pHVar15->dict_num_matches = local_140;
        local_1c8 = uVar62;
        local_138 = pvVar26;
        uVar45 = uVar65;
      }
    }
  }
  lVar42 = lVar42 + 1;
  uVar57 = uVar57 + 1;
  goto LAB_01f3a946;
LAB_01f3ab0d:
  if (0x1f < uVar64) {
    for (pvVar26 = (hasher->privat)._H35.ha_common.extra[3]; pvVar26 <= pvVar28;
        pvVar26 = (void *)((long)pvVar26 + 1)) {
      uVar48 = (hasher->privat)._H65.hb.state;
      uVar30 = uVar48 & 0x3fffffff;
      (hasher->privat)._H65.hb.state =
           uVar48 * (hasher->privat)._H65.hb.factor +
           (uint)ringbuffer[(long)pvVar26 + 0x20U & ringbuffer_mask] +
           ~(uint)ringbuffer[(ulong)pvVar26 & ringbuffer_mask] *
           (hasher->privat)._H65.hb.factor_remove + 1;
      if (uVar30 < 0x1000000) {
        pvVar54 = (hasher->privat)._H35.ha_common.extra[2];
        uVar48 = *(uint *)((long)pvVar54 + (ulong)uVar30 * 4);
        *(int *)((long)pvVar54 + (ulong)uVar30 * 4) = (int)pvVar26;
        if ((pvVar26 == pvVar28) && (uVar48 != 0xffffffff)) {
          uVar30 = (uint32_t)pvVar28 - uVar48;
          if ((void *)(ulong)uVar30 <= pvVar63) {
            puVar32 = (ulong *)(ringbuffer + (uVar48 & uVar52));
            lVar42 = 0;
            uVar43 = uVar64;
            puVar58 = puVar2;
LAB_01f3abd3:
            if (uVar43 < 8) {
              for (uVar57 = 0;
                  (uVar43 != uVar57 &&
                  (*(char *)((long)puVar32 + uVar57) == *(char *)((long)puVar58 + uVar57)));
                  uVar57 = uVar57 + 1) {
              }
            }
            else {
              if (*puVar58 == *puVar32) goto code_r0x01f3abe4;
              uVar57 = *puVar32 ^ *puVar58;
              uVar43 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar57 = uVar43 >> 3 & 0x1fffffff;
            }
            uVar57 = uVar57 - lVar42;
            if ((3 < uVar57) && (uVar45 < uVar57)) {
              iVar51 = 0x1f;
              if (uVar30 != 0) {
                for (; uVar30 >> iVar51 == 0; iVar51 = iVar51 + -1) {
                }
              }
              uVar43 = (ulong)(iVar51 * -0x1e + 0x780) + uVar57 * 0x87;
              if (local_1c8 < uVar43) {
                iVar50 = 0;
                uVar45 = uVar57;
                local_138 = (void *)(ulong)uVar30;
                local_1c8 = uVar43;
              }
            }
          }
        }
      }
    }
    (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar28 + 1);
  }
  sVar18 = (params->dictionary).compound.num_chunks;
  sVar19 = (params->dictionary).compound.total_size;
  sVar34 = 0;
LAB_01f3ac9b:
  if (sVar34 != sVar18) {
    pPVar20 = (params->dictionary).compound.chunks[sVar34];
    bVar29 = (byte)pPVar20->bucket_bits;
    bVar46 = (byte)pPVar20->slot_bits;
    bVar25 = -(char)pPVar20->hash_bits;
    uVar43 = ((*puVar2 << (bVar25 & 0x3f)) >> (bVar25 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar29 & 0x3f);
    lVar42 = (1L << (bVar46 & 0x3f)) * 4;
    lVar38 = (1L << (bVar29 & 0x3f)) * 2;
    bVar46 = -bVar46;
    uVar48 = (uint)*(ushort *)((long)&pPVar20[1].magic + (uVar43 & 0xffffffff) * 2 + lVar42);
    puVar27 = (undefined8 *)
              ((long)&pPVar20[1].magic + (ulong)pPVar20->num_items * 4 + lVar38 + lVar42);
    if (pPVar20->magic != 0xdebcede0) {
      puVar27 = (undefined8 *)*puVar27;
    }
    pvVar63 = (void *)((long)pvVar36 +
                      (sVar19 - (params->dictionary).compound.chunk_offsets[sVar34]));
    uVar57 = (ulong)pPVar20->source_size;
    puVar39 = (uint *)((long)&pPVar20[1].magic +
                      (ulong)(uVar48 + (&pPVar20[1].magic)
                                       [(uint)((int)uVar43 << (bVar46 & 0x1f)) >> (bVar46 & 0x1f)])
                      * 4 + lVar38 + lVar42);
    uVar48 = (uint)(uVar48 == 0xffff);
    lVar42 = 0;
    local_198 = local_1c8;
    local_1d8 = uVar45;
    do {
      if (lVar42 == 4) {
        do {
          do {
            do {
              do {
                if (uVar48 != 0) {
                  sVar34 = sVar34 + 1;
                  goto LAB_01f3ac9b;
                }
                uVar48 = *puVar39;
                puVar39 = puVar39 + 1;
                uVar62 = (ulong)(uVar48 & 0x7fffffff);
                uVar48 = uVar48 & 0x80000000;
                pvVar26 = (void *)((long)pvVar63 - uVar62);
                uVar43 = uVar57 - uVar62;
                if (uVar64 <= uVar57 - uVar62) {
                  uVar43 = uVar64;
                }
              } while ((((pvVar11 < pvVar26) || (ringbuffer_mask < uVar53 + local_1d8)) ||
                       (uVar43 <= local_1d8)) ||
                      (ringbuffer[uVar53 + local_1d8] !=
                       *(uint8_t *)((long)puVar27 + local_1d8 + uVar62)));
              lVar42 = (long)puVar27 + uVar62;
              uVar31 = 0;
              lVar38 = 0;
              uVar65 = uVar43;
              puVar58 = puVar2;
LAB_01f3af63:
              if (7 < uVar65) {
                if (*puVar58 == *(ulong *)(lVar42 + uVar31)) goto code_r0x01f3af75;
                uVar62 = *(ulong *)(lVar42 + uVar31) ^ *puVar58;
                uVar43 = 0;
                if (uVar62 != 0) {
                  for (; (uVar62 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar43 = (uVar43 >> 3 & 0x1fffffff) - lVar38;
                goto LAB_01f3afcb;
              }
              lVar38 = uVar62 + uVar43 + (long)puVar27;
              for (; uVar43 != uVar31; uVar31 = uVar31 + 1) {
                if (*(char *)(lVar42 + uVar31) != *(char *)((long)puVar2 + uVar31)) {
                  lVar38 = uVar31 + lVar42;
                  break;
                }
              }
              uVar43 = lVar38 - lVar42;
LAB_01f3afcb:
            } while (uVar43 < 4);
            iVar51 = 0x1f;
            if ((uint)pvVar26 != 0) {
              for (; (uint)pvVar26 >> iVar51 == 0; iVar51 = iVar51 + -1) {
              }
            }
            uVar62 = (ulong)(iVar51 * -0x1e + 0x780) + uVar43 * 0x87;
          } while (uVar62 <= local_198);
          iVar50 = 0;
          uVar45 = uVar43;
          local_138 = pvVar26;
          local_1d8 = uVar43;
          local_1c8 = uVar62;
          local_198 = uVar62;
        } while( true );
      }
      pvVar26 = (void *)(long)dist_cache[lVar42];
      if (((void *)((long)pvVar63 - uVar57) < pvVar26) &&
         (lVar38 = (long)pvVar63 - (long)pvVar26, pvVar26 <= pvVar63)) {
        uVar43 = uVar57 - lVar38;
        if (uVar64 <= uVar57 - lVar38) {
          uVar43 = uVar64;
        }
        uVar65 = 0;
        uVar62 = uVar43;
LAB_01f3adce:
        if (uVar62 < 8) {
          for (pcVar33 = (char *)((long)puVar27 + uVar65 + lVar38);
              (uVar43 != uVar65 && (*pcVar33 == *(char *)((long)puVar2 + uVar65)));
              pcVar33 = pcVar33 + 1) {
            uVar65 = uVar65 + 1;
          }
        }
        else {
          uVar31 = *(ulong *)((long)puVar27 + uVar65 + lVar38);
          if (*(ulong *)((long)puVar2 + uVar65) == uVar31) goto code_r0x01f3ade1;
          uVar31 = uVar31 ^ *(ulong *)((long)puVar2 + uVar65);
          uVar43 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
            }
          }
          uVar65 = uVar65 + (uVar43 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar65) && (uVar43 = uVar65 * 0x87 + 0x78f, local_198 < uVar43)) {
          if (lVar42 != 0) {
            uVar43 = uVar43 - ((0x1ca10U >> ((byte)lVar42 & 2) & 4) + 0x27);
          }
          if (local_198 < uVar43) {
            if (local_1d8 < uVar65) {
              local_1d8 = uVar65;
            }
            iVar50 = 0;
            local_138 = pvVar26;
            local_1c8 = uVar43;
            uVar45 = uVar65;
            local_198 = uVar43;
          }
        }
      }
      lVar42 = lVar42 + 1;
    } while( true );
  }
  if (local_1c8 < 0x7e5) {
    uVar44 = uVar44 + 1;
    position = (long)pvVar28 + 1;
    if (pvVar49 < position) {
      if ((void *)((long)pvVar49 + (ulong)(uint)((int)lVar41 * 4)) < position) {
        pvVar63 = (void *)((long)pvVar28 + 0x11U);
        if (pvVar5 <= (void *)((long)pvVar28 + 0x11U)) {
          pvVar63 = pvVar5;
        }
        for (; position < pvVar63; position = position + 4) {
          uVar43 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar14 >> 0x31;
          uVar7 = *(ushort *)((long)puVar12 + uVar43 * 2);
          uVar48 = (hasher->privat)._H6.block_mask_;
          bVar29 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar12 + uVar43 * 2) = uVar7 + 1;
          puVar13[(uVar43 << (bVar29 & 0x3f)) + (ulong)(uVar48 & uVar7)] = (uint32_t)position;
          uVar44 = uVar44 + 4;
        }
      }
      else {
        pvVar63 = (void *)((long)pvVar28 + 9U);
        if (pvVar5 <= (void *)((long)pvVar28 + 9U)) {
          pvVar63 = pvVar5;
        }
        for (; position < pvVar63; position = position + 2) {
          uVar43 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar14 >> 0x31;
          uVar7 = *(ushort *)((long)puVar12 + uVar43 * 2);
          uVar48 = (hasher->privat)._H6.block_mask_;
          bVar29 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar12 + uVar43 * 2) = uVar7 + 1;
          puVar13[(uVar43 << (bVar29 & 0x3f)) + (ulong)(uVar48 & uVar7)] = (uint32_t)position;
          uVar44 = uVar44 + 2;
        }
      }
    }
    goto LAB_01f3a483;
  }
  pvVar63 = (void *)(sVar8 + 1 + (long)pvVar28);
  local_140 = (lVar4 + num_bytes) - (long)pvVar28;
  local_108 = 0;
  uVar43 = uVar44;
LAB_01f3b1d4:
  pvVar36 = pvVar6;
  if (pvVar63 < pvVar6) {
    pvVar36 = pvVar63;
  }
  uVar57 = uVar64 - 1;
  uVar62 = uVar45 - 1;
  if (uVar57 <= uVar45 - 1) {
    uVar62 = uVar57;
  }
  if (4 < params->quality) {
    uVar62 = 0;
  }
  pvVar49 = (void *)((long)pvVar28 + 1);
  pvVar26 = pvVar6;
  if (pvVar49 < pvVar6) {
    pvVar26 = pvVar49;
  }
  local_100 = (void *)((long)pvVar28 + sVar8 + 1);
  if (pvVar6 <= local_100) {
    local_100 = pvVar6;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_104 = (uint)(params->dictionary).contextual.context_map
                      [literal_context_lut[local_d8 + 0x100] |
                       literal_context_lut[ringbuffer[(ulong)pvVar28 & ringbuffer_mask]]];
    local_d8 = (ulong)ringbuffer[(ulong)pvVar28 & ringbuffer_mask];
  }
  pBVar10 = (params->dictionary).contextual.dict[local_104];
  uVar31 = (ulong)pvVar49 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar31);
  uVar65 = 0x7e4;
  pvVar54 = (void *)0x0;
  uVar53 = 0;
  uVar66 = 0;
  do {
    if (uVar66 == (long)(hasher->privat)._H6.num_last_distances_to_check_) {
      uVar61 = *puVar2 * uVar14 >> 0x31;
      lVar42 = uVar61 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar7 = *(ushort *)((long)puVar12 + uVar61 * 2);
      uVar35 = (ulong)uVar7;
      uVar66 = 0;
      if (uVar60 <= uVar35) {
        uVar66 = uVar35 - uVar60;
      }
      uVar48 = (hasher->privat)._H6.block_mask_;
      do {
        uVar59 = uVar62;
        local_150 = uVar65;
        local_1a8 = uVar53;
        pvVar55 = pvVar54;
        uVar3 = uVar59 + uVar31;
        do {
          do {
            do {
              if (uVar35 <= uVar66) {
LAB_01f3b5b4:
                puVar13[lVar42 + (ulong)(uVar48 & uVar7)] = (uint32_t)pvVar49;
                *(ushort *)((long)puVar12 + uVar61 * 2) = uVar7 + 1;
                iVar51 = 0;
                if (local_150 != 0x7e4) goto LAB_01f3b80f;
                pHVar15 = (hasher->privat)._H6.common_;
                uVar62 = pHVar15->dict_num_lookups;
                local_160 = pHVar15->dict_num_matches;
                if (uVar62 >> 7 <= local_160) {
                  uVar64 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar16 = pBVar10->hash_table_lengths;
                  local_150 = 0x7e4;
                  iVar51 = 0;
                  lVar42 = 0;
                  goto LAB_01f3b67f;
                }
                local_150 = 0x7e4;
                goto LAB_01f3b80f;
              }
              uVar35 = uVar35 - 1;
              pvVar54 = (void *)((long)pvVar49 -
                                (ulong)puVar13[lVar42 + (ulong)((uint)uVar35 & uVar48)]);
              if (pvVar26 < pvVar54) goto LAB_01f3b5b4;
            } while (ringbuffer_mask < uVar3);
            uVar53 = (ulong)(puVar13[lVar42 + (ulong)((uint)uVar35 & uVar48)] & uVar52);
            uVar62 = uVar53 + uVar59;
          } while (((ringbuffer_mask < uVar62) || (ringbuffer[uVar3] != ringbuffer[uVar62])) ||
                  (*(int *)(ringbuffer + uVar53) != (int)*puVar2));
          lVar38 = 0;
          uVar62 = uVar64 - 5;
LAB_01f3b537:
          if (uVar62 < 8) {
            for (; (bVar67 = uVar62 != 0, uVar62 = uVar62 - 1, bVar67 &&
                   (ringbuffer[lVar38 + uVar53 + 4] == *(uint8_t *)((long)puVar2 + lVar38 + 4)));
                lVar38 = lVar38 + 1) {
            }
          }
          else {
            uVar65 = *(ulong *)((long)puVar2 + lVar38 + 4);
            if (uVar65 == *(ulong *)(ringbuffer + lVar38 + uVar53 + 4)) goto code_r0x01f3b54a;
            uVar65 = *(ulong *)(ringbuffer + lVar38 + uVar53 + 4) ^ uVar65;
            uVar62 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
              }
            }
            lVar38 = lVar38 + (uVar62 >> 3 & 0x1fffffff);
          }
          uVar53 = lVar38 + 4;
          iVar51 = 0x1f;
          if ((uint)pvVar54 != 0) {
            for (; (uint)pvVar54 >> iVar51 == 0; iVar51 = iVar51 + -1) {
            }
          }
          uVar65 = (ulong)(iVar51 * -0x1e + 0x780) + uVar53 * 0x87;
          uVar62 = uVar53;
        } while (uVar65 <= local_150);
      } while( true );
    }
    pvVar55 = (void *)(long)dist_cache[uVar66];
    if (((pvVar55 <= pvVar26) && ((void *)((long)pvVar49 - (long)pvVar55) < pvVar49)) &&
       (uVar31 + uVar62 <= ringbuffer_mask)) {
      uVar35 = (ulong)((long)pvVar49 - (long)pvVar55) & ringbuffer_mask;
      uVar61 = uVar35 + uVar62;
      if ((uVar61 <= ringbuffer_mask) && (ringbuffer[uVar31 + uVar62] == ringbuffer[uVar61])) {
        puVar32 = (ulong *)(ringbuffer + uVar35);
        lVar42 = 0;
        uVar61 = uVar57;
        puVar58 = puVar2;
LAB_01f3b34e:
        if (uVar61 < 8) {
          for (uVar35 = 0;
              (uVar61 != uVar35 &&
              (*(char *)((long)puVar32 + uVar35) == *(char *)((long)puVar58 + uVar35)));
              uVar35 = uVar35 + 1) {
          }
          uVar35 = uVar35 - lVar42;
        }
        else {
          if (*puVar58 == *puVar32) goto code_r0x01f3b35f;
          uVar35 = *puVar32 ^ *puVar58;
          uVar61 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
            }
          }
          uVar35 = (uVar61 >> 3 & 0x1fffffff) - lVar42;
        }
        if (((2 < uVar35) || ((uVar66 < 2 && (uVar35 == 2)))) &&
           (uVar61 = uVar35 * 0x87 + 0x78f, uVar65 < uVar61)) {
          if (uVar66 != 0) {
            uVar61 = uVar61 - ((0x1ca10U >> ((byte)uVar66 & 0xe) & 0xe) + 0x27);
          }
          if (uVar65 < uVar61) {
            pvVar54 = pvVar55;
            uVar53 = uVar35;
            uVar65 = uVar61;
            uVar62 = uVar35;
          }
        }
      }
    }
    uVar66 = uVar66 + 1;
  } while( true );
code_r0x01f3abe4:
  puVar58 = puVar58 + 1;
  puVar32 = puVar32 + 1;
  uVar43 = uVar43 - 8;
  lVar42 = lVar42 + -8;
  goto LAB_01f3abd3;
code_r0x01f3af75:
  puVar58 = puVar58 + 1;
  uVar65 = uVar65 - 8;
  lVar38 = lVar38 + -8;
  uVar31 = uVar31 + 8;
  goto LAB_01f3af63;
code_r0x01f3ade1:
  uVar62 = uVar62 - 8;
  uVar65 = uVar65 + 8;
  goto LAB_01f3adce;
LAB_01f3b67f:
  if (lVar42 == 2) goto LAB_01f3b80f;
  uVar62 = uVar62 + 1;
  pHVar15->dict_num_lookups = uVar62;
  bVar29 = puVar16[uVar64];
  uVar53 = (ulong)bVar29;
  if ((uVar53 != 0) && (uVar53 <= uVar57)) {
    pBVar17 = pBVar10->words;
    puVar32 = (ulong *)(pBVar17->data +
                       (ulong)pBVar17->offsets_by_length[uVar53] +
                       pBVar10->hash_table_words[uVar64] * uVar53);
    lVar38 = 0;
    uVar65 = uVar53;
    puVar58 = puVar2;
LAB_01f3b6ed:
    if (uVar65 < 8) {
      for (uVar65 = 0;
          ((bVar29 & 7) != uVar65 &&
          (*(char *)((long)puVar58 + uVar65) == *(char *)((long)puVar32 + uVar65)));
          uVar65 = uVar65 + 1) {
      }
    }
    else {
      if (*puVar32 == *puVar58) goto code_r0x01f3b6ff;
      uVar66 = *puVar58 ^ *puVar32;
      uVar65 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
        }
      }
      uVar65 = uVar65 >> 3 & 0x1fffffff;
    }
    uVar65 = uVar65 - lVar38;
    if (((uVar65 != 0) && (uVar53 < pBVar10->cutoffTransformsCount + uVar65)) &&
       (pvVar54 = (void *)((long)local_100 +
                          ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                         ((char)(uVar53 - uVar65) * '\x06' & 0x3fU)) & 0x3f) +
                           (uVar53 - uVar65) * 4 << (pBVar17->size_bits_by_length[uVar53] & 0x3f)) +
                          (ulong)pBVar10->hash_table_words[uVar64] + lVar56), pvVar54 <= pvVar11)) {
      iVar24 = 0x1f;
      if ((uint)pvVar54 != 0) {
        for (; (uint)pvVar54 >> iVar24 == 0; iVar24 = iVar24 + -1) {
        }
      }
      uVar53 = (uVar65 * 0x87 - (ulong)(uint)(iVar24 * 0x1e)) + 0x780;
      if (local_150 <= uVar53) {
        iVar51 = (uint)bVar29 - (int)uVar65;
        local_160 = local_160 + 1;
        pHVar15->dict_num_matches = local_160;
        local_150 = uVar53;
        local_1a8 = uVar65;
        pvVar55 = pvVar54;
      }
    }
  }
  lVar42 = lVar42 + 1;
  uVar64 = uVar64 + 1;
  goto LAB_01f3b67f;
LAB_01f3b80f:
  if (0x1f < uVar57) {
    for (pvVar54 = (hasher->privat)._H35.ha_common.extra[3]; pvVar54 <= pvVar49;
        pvVar54 = (void *)((long)pvVar54 + 1)) {
      uVar48 = (hasher->privat)._H65.hb.state;
      uVar30 = uVar48 & 0x3fffffff;
      (hasher->privat)._H65.hb.state =
           uVar48 * (hasher->privat)._H65.hb.factor +
           (uint)ringbuffer[(long)pvVar54 + 0x20U & ringbuffer_mask] +
           ~(uint)ringbuffer[(ulong)pvVar54 & ringbuffer_mask] *
           (hasher->privat)._H65.hb.factor_remove + 1;
      if (uVar30 < 0x1000000) {
        pvVar21 = (hasher->privat)._H35.ha_common.extra[2];
        uVar48 = *(uint *)((long)pvVar21 + (ulong)uVar30 * 4);
        *(int *)((long)pvVar21 + (ulong)uVar30 * 4) = (int)pvVar54;
        if ((pvVar54 == pvVar49) && (uVar48 != 0xffffffff)) {
          uVar30 = (uint32_t)pvVar49 - uVar48;
          if ((void *)(ulong)uVar30 <= pvVar26) {
            puVar32 = (ulong *)(ringbuffer + (uVar48 & uVar52));
            lVar42 = 0;
            uVar62 = uVar57;
            puVar58 = puVar2;
LAB_01f3b8d6:
            if (uVar62 < 8) {
              for (uVar64 = 0;
                  (uVar62 != uVar64 &&
                  (*(char *)((long)puVar32 + uVar64) == *(char *)((long)puVar58 + uVar64)));
                  uVar64 = uVar64 + 1) {
              }
            }
            else {
              if (*puVar58 == *puVar32) goto code_r0x01f3b8e7;
              uVar64 = *puVar32 ^ *puVar58;
              uVar62 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                }
              }
              uVar64 = uVar62 >> 3 & 0x1fffffff;
            }
            uVar64 = uVar64 - lVar42;
            if ((3 < uVar64) && (local_1a8 < uVar64)) {
              iVar24 = 0x1f;
              if (uVar30 != 0) {
                for (; uVar30 >> iVar24 == 0; iVar24 = iVar24 + -1) {
                }
              }
              uVar62 = (ulong)(iVar24 * -0x1e + 0x780) + uVar64 * 0x87;
              if (local_150 < uVar62) {
                iVar51 = 0;
                pvVar55 = (void *)(ulong)uVar30;
                local_1a8 = uVar64;
                local_150 = uVar62;
              }
            }
          }
        }
      }
    }
    (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar28 + 2);
  }
  sVar34 = 0;
LAB_01f3b9c6:
  if (sVar34 != sVar18) {
    pPVar20 = (params->dictionary).compound.chunks[sVar34];
    bVar29 = (byte)pPVar20->bucket_bits;
    bVar46 = (byte)pPVar20->slot_bits;
    bVar25 = -(char)pPVar20->hash_bits;
    uVar62 = ((*puVar2 << (bVar25 & 0x3f)) >> (bVar25 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar29 & 0x3f);
    lVar42 = (1L << (bVar46 & 0x3f)) * 4;
    lVar38 = (1L << (bVar29 & 0x3f)) * 2;
    bVar46 = -bVar46;
    uVar48 = (uint)*(ushort *)((long)&pPVar20[1].magic + (uVar62 & 0xffffffff) * 2 + lVar42);
    puVar27 = (undefined8 *)
              ((long)&pPVar20[1].magic + (ulong)pPVar20->num_items * 4 + lVar38 + lVar42);
    if (pPVar20->magic != 0xdebcede0) {
      puVar27 = (undefined8 *)*puVar27;
    }
    sVar22 = (params->dictionary).compound.chunk_offsets[sVar34];
    pvVar26 = (void *)((long)local_100 + (sVar19 - sVar22));
    uVar64 = (ulong)pPVar20->source_size;
    puVar39 = (uint *)((long)&pPVar20[1].magic +
                      (ulong)(uVar48 + (&pPVar20[1].magic)
                                       [(uint)((int)uVar62 << (bVar46 & 0x1f)) >> (bVar46 & 0x1f)])
                      * 4 + lVar38 + lVar42);
    uVar48 = (uint)(uVar48 == 0xffff);
    lVar42 = 0;
    local_158 = local_1a8;
    local_1d8 = local_150;
    do {
      if (lVar42 == 4) {
        do {
          do {
            do {
              do {
                if (uVar48 != 0) {
                  sVar34 = sVar34 + 1;
                  goto LAB_01f3b9c6;
                }
                uVar48 = *puVar39;
                puVar39 = puVar39 + 1;
                uVar53 = (ulong)(uVar48 & 0x7fffffff);
                uVar48 = uVar48 & 0x80000000;
                pvVar54 = (void *)((long)pvVar26 - uVar53);
                uVar62 = uVar64 - uVar53;
                if (uVar57 <= uVar64 - uVar53) {
                  uVar62 = uVar57;
                }
              } while ((((pvVar11 < pvVar54) || (ringbuffer_mask < uVar31 + local_158)) ||
                       (uVar62 <= local_158)) ||
                      (ringbuffer[uVar31 + local_158] !=
                       *(uint8_t *)((long)puVar27 + uVar53 + local_158)));
              puVar32 = (ulong *)(uVar53 + (long)puVar27);
              lVar42 = 0;
              puVar58 = puVar2;
LAB_01f3bc9d:
              if (uVar62 < 8) {
                for (uVar53 = 0;
                    (uVar62 != uVar53 &&
                    (*(char *)((long)puVar32 + uVar53) == *(char *)((long)puVar58 + uVar53)));
                    uVar53 = uVar53 + 1) {
                }
              }
              else {
                if (*puVar58 == *puVar32) goto code_r0x01f3bcaf;
                uVar53 = *puVar32 ^ *puVar58;
                uVar62 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                  }
                }
                uVar53 = uVar62 >> 3 & 0x1fffffff;
              }
              uVar53 = uVar53 - lVar42;
            } while (uVar53 < 4);
            iVar24 = 0x1f;
            if ((uint)pvVar54 != 0) {
              for (; (uint)pvVar54 >> iVar24 == 0; iVar24 = iVar24 + -1) {
              }
            }
            uVar62 = (ulong)(iVar24 * -0x1e + 0x780) + uVar53 * 0x87;
          } while (uVar62 <= local_1d8);
          iVar51 = 0;
          pvVar55 = pvVar54;
          local_158 = uVar53;
          local_1d8 = uVar62;
          local_1a8 = uVar53;
          local_150 = uVar62;
        } while( true );
      }
      pvVar54 = (void *)(long)dist_cache[lVar42];
      if (((void *)((long)pvVar26 - uVar64) < pvVar54) && (pvVar54 <= pvVar26)) {
        uVar62 = (long)pvVar54 + (uVar64 - (long)pvVar26);
        if (uVar57 <= uVar62) {
          uVar62 = uVar57;
        }
        lVar38 = (sVar19 - sVar22) - (long)pvVar54;
        uVar53 = 0;
LAB_01f3bb2c:
        if (uVar62 < 8) {
          pcVar33 = (char *)((long)puVar27 + (long)pvVar36 + uVar53 + lVar38);
          uVar62 = sVar22 + (-(long)pvVar36 - sVar19) + uVar64 + (long)pvVar54;
          if (local_140 < uVar62) {
            uVar62 = local_140;
          }
          for (; (uVar62 != uVar53 && (*pcVar33 == *(char *)((long)puVar2 + uVar53)));
              pcVar33 = pcVar33 + 1) {
            uVar53 = uVar53 + 1;
          }
        }
        else {
          uVar65 = *(ulong *)((long)puVar27 + (long)pvVar36 + uVar53 + lVar38);
          if (*(ulong *)((long)puVar2 + uVar53) == uVar65) goto code_r0x01f3bb3f;
          uVar65 = uVar65 ^ *(ulong *)((long)puVar2 + uVar53);
          uVar62 = 0;
          if (uVar65 != 0) {
            for (; (uVar65 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
            }
          }
          uVar53 = uVar53 + (uVar62 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar53) && (uVar62 = uVar53 * 0x87 + 0x78f, local_1d8 < uVar62)) {
          if (lVar42 != 0) {
            uVar62 = uVar62 - ((0x1ca10U >> ((byte)lVar42 & 2) & 4) + 0x27);
          }
          if (local_1d8 < uVar62) {
            if (local_158 < uVar53) {
              local_158 = uVar53;
            }
            iVar51 = 0;
            pvVar55 = pvVar54;
            local_1a8 = uVar53;
            local_150 = uVar62;
            local_1d8 = uVar62;
          }
        }
      }
      lVar42 = lVar42 + 1;
    } while( true );
  }
  if (local_150 < local_1c8 + 0xaf) {
    pvVar49 = pvVar28;
    uVar62 = uVar43;
    local_1a8 = uVar45;
    pvVar55 = local_138;
    iVar51 = iVar50;
    local_100 = (void *)((long)pvVar28 + sVar8);
    if (pvVar6 <= (void *)((long)pvVar28 + sVar8)) {
      local_100 = pvVar6;
    }
    goto LAB_01f3be3a;
  }
  uVar62 = uVar44 + 4;
  if (local_108 == 3) goto LAB_01f3be3a;
  uVar62 = uVar43 + 1;
  local_108 = local_108 + 1;
  uVar53 = (long)pvVar28 + 9;
  pvVar63 = (void *)((long)pvVar63 + 1);
  local_140 = local_140 - 1;
  pvVar28 = pvVar49;
  local_1c8 = local_150;
  uVar45 = local_1a8;
  uVar43 = uVar62;
  uVar64 = uVar57;
  local_138 = pvVar55;
  iVar50 = iVar51;
  if (uVar1 <= uVar53) goto LAB_01f3be3a;
  goto LAB_01f3b1d4;
code_r0x01f3b8e7:
  puVar58 = puVar58 + 1;
  puVar32 = puVar32 + 1;
  uVar62 = uVar62 - 8;
  lVar42 = lVar42 + -8;
  goto LAB_01f3b8d6;
code_r0x01f3bcaf:
  puVar58 = puVar58 + 1;
  puVar32 = puVar32 + 1;
  uVar62 = uVar62 - 8;
  lVar42 = lVar42 + -8;
  goto LAB_01f3bc9d;
code_r0x01f3bb3f:
  uVar62 = uVar62 - 8;
  uVar53 = uVar53 + 8;
  goto LAB_01f3bb2c;
LAB_01f3be3a:
  local_100 = (void *)((long)local_100 + sVar9);
  if (local_100 < pvVar55) {
LAB_01f3be61:
    uVar44 = (long)pvVar55 + 0xf;
  }
  else {
    if (pvVar55 == (void *)(long)*dist_cache) {
      uVar44 = 0;
      goto LAB_01f3bef0;
    }
    uVar44 = 1;
    if (pvVar55 != (void *)(long)dist_cache[1]) {
      uVar44 = (long)pvVar55 + (3 - (long)*dist_cache);
      if (uVar44 < 7) {
        bVar29 = (byte)((int)uVar44 << 2);
        uVar48 = 0x9750468;
      }
      else {
        uVar44 = (long)pvVar55 + (3 - (long)dist_cache[1]);
        if (6 < uVar44) {
          uVar44 = 2;
          if ((pvVar55 != (void *)(long)dist_cache[2]) &&
             (uVar44 = 3, pvVar55 != (void *)(long)dist_cache[3])) goto LAB_01f3be61;
          goto LAB_01f3be66;
        }
        bVar29 = (byte)((int)uVar44 << 2);
        uVar48 = 0xfdb1ace;
      }
      uVar44 = (ulong)(uVar48 >> (bVar29 & 0x1f) & 0xf);
    }
  }
LAB_01f3be66:
  if ((pvVar55 <= local_100) && (uVar44 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar23 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar23;
    iVar50 = (int)pvVar55;
    *dist_cache = iVar50;
    uVar48 = (uint)(hasher->privat)._H35.hb.next_ix;
    if (4 < (int)uVar48) {
      dist_cache[4] = iVar50 + -1;
      dist_cache[5] = iVar50 + 1;
      dist_cache[6] = iVar50 + -2;
      dist_cache[7] = iVar50 + 2;
      dist_cache[8] = iVar50 + -3;
      dist_cache[9] = iVar50 + 3;
      if (10 < uVar48) {
        iVar50 = (int)uVar23;
        dist_cache[10] = iVar50 + -1;
        dist_cache[0xb] = iVar50 + 1;
        dist_cache[0xc] = iVar50 + -2;
        dist_cache[0xd] = iVar50 + 2;
        *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar50 + 3,iVar50 + -3);
      }
    }
  }
LAB_01f3bef0:
  local_128->insert_len_ = (uint32_t)uVar62;
  local_128->copy_len_ = iVar51 << 0x19 | (uint)local_1a8;
  uVar57 = (ulong)(params->dist).num_direct_distance_codes;
  uVar43 = uVar57 + 0x10;
  uVar37 = 0;
  if (uVar43 <= uVar44) {
    uVar48 = (params->dist).distance_postfix_bits;
    bVar29 = (byte)uVar48;
    uVar57 = ((4L << (bVar29 & 0x3f)) + (uVar44 - uVar57)) - 0x10;
    uVar52 = 0x1f;
    uVar30 = (uint)uVar57;
    if (uVar30 != 0) {
      for (; uVar30 >> uVar52 == 0; uVar52 = uVar52 - 1) {
      }
    }
    uVar52 = (uVar52 ^ 0xffffffe0) + 0x1f;
    uVar64 = (ulong)((uVar57 >> ((ulong)uVar52 & 0x3f) & 1) != 0);
    lVar42 = (ulong)uVar52 - (ulong)uVar48;
    uVar44 = (~(-1 << (bVar29 & 0x1f)) & uVar30) + uVar43 +
             (uVar64 + lVar42 * 2 + 0xfffe << (bVar29 & 0x3f)) | lVar42 * 0x400;
    uVar37 = (uint32_t)(uVar57 - (uVar64 + 2 << ((byte)uVar52 & 0x3f)) >> (bVar29 & 0x3f));
  }
  local_128->dist_prefix_ = (uint16_t)uVar44;
  local_128->dist_extra_ = uVar37;
  if (uVar62 < 6) {
    uVar43 = uVar62 & 0xffffffff;
  }
  else if (uVar62 < 0x82) {
    uVar48 = 0x1f;
    uVar52 = (uint)(uVar62 - 2);
    if (uVar52 != 0) {
      for (; uVar52 >> uVar48 == 0; uVar48 = uVar48 - 1) {
      }
    }
    uVar43 = (ulong)((int)(uVar62 - 2 >> ((char)(uVar48 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar48 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (uVar62 < 0x842) {
    uVar52 = (uint32_t)uVar62 - 0x42;
    uVar48 = 0x1f;
    if (uVar52 != 0) {
      for (; uVar52 >> uVar48 == 0; uVar48 = uVar48 - 1) {
      }
    }
    uVar43 = (ulong)((uVar48 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar43 = 0x15;
    if (0x1841 < uVar62) {
      uVar43 = (ulong)(ushort)(0x17 - (uVar62 < 0x5842));
    }
  }
  uVar48 = iVar51 + (uint)local_1a8;
  if (uVar48 < 10) {
    uVar52 = uVar48 - 2;
  }
  else if (uVar48 < 0x86) {
    uVar48 = uVar48 - 6;
    uVar52 = 0x1f;
    if (uVar48 != 0) {
      for (; uVar48 >> uVar52 == 0; uVar52 = uVar52 - 1) {
      }
    }
    uVar52 = (uVar48 >> ((char)(uVar52 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar52 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar52 = 0x17;
    if (uVar48 < 0x846) {
      uVar52 = 0x1f;
      if (uVar48 - 0x46 != 0) {
        for (; uVar48 - 0x46 >> uVar52 == 0; uVar52 = uVar52 - 1) {
        }
      }
      uVar52 = (uVar52 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar52;
  uVar47 = (uVar7 & 7) + ((ushort)uVar43 & 7) * 8;
  if ((((uVar44 & 0x3ff) == 0) && ((ushort)uVar43 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      uVar47 = uVar47 + 0x40;
    }
  }
  else {
    iVar50 = (int)((uVar43 & 0xffff) >> 3) * 3 + ((uVar52 & 0xffff) >> 3);
    uVar47 = uVar47 + ((ushort)(0x520d40 >> ((char)iVar50 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar50 * 0x40 + 0x40;
  }
  local_128->cmd_prefix_ = uVar47;
  *num_literals = *num_literals + uVar62;
  position = local_1a8 + (long)pvVar49;
  pvVar28 = pvVar40;
  if (position < pvVar40) {
    pvVar28 = (void *)position;
  }
  pvVar63 = (void *)((long)pvVar49 + 2);
  if (pvVar55 < (void *)(local_1a8 >> 2)) {
    pvVar36 = (void *)(position + (long)pvVar55 * -4);
    if (pvVar36 < pvVar63) {
      pvVar36 = pvVar63;
    }
    pvVar63 = pvVar36;
    if (pvVar28 < pvVar36) {
      pvVar63 = pvVar28;
    }
  }
  pvVar49 = (void *)((long)pvVar49 + local_1a8 * 2 + lVar41);
  local_128 = local_128 + 1;
  for (; pvVar63 < pvVar28; pvVar63 = (void *)((long)pvVar63 + 1)) {
    uVar44 = *(long *)(ringbuffer + ((ulong)pvVar63 & ringbuffer_mask)) *
             (hasher->privat)._H6.hash_mul_ >> 0x31;
    uVar7 = *(ushort *)((long)puVar12 + uVar44 * 2);
    uVar48 = (hasher->privat)._H6.block_mask_;
    bVar29 = *(byte *)((long)&hasher->privat + 0x1c);
    *(ushort *)((long)puVar12 + uVar44 * 2) = uVar7 + 1;
    puVar13[(uVar44 << (bVar29 & 0x3f)) + (ulong)(uVar48 & uVar7)] = (uint32_t)pvVar63;
  }
  uVar44 = 0;
  goto LAB_01f3a475;
code_r0x01f3b6ff:
  puVar32 = puVar32 + 1;
  puVar58 = puVar58 + 1;
  uVar65 = uVar65 - 8;
  lVar38 = lVar38 + -8;
  goto LAB_01f3b6ed;
code_r0x01f3b54a:
  uVar62 = uVar62 - 8;
  lVar38 = lVar38 + 8;
  goto LAB_01f3b537;
code_r0x01f3b35f:
  puVar58 = puVar58 + 1;
  puVar32 = puVar32 + 1;
  uVar61 = uVar61 - 8;
  lVar42 = lVar42 + -8;
  goto LAB_01f3b34e;
code_r0x01f3a9d7:
  puVar32 = puVar32 + 1;
  puVar58 = puVar58 + 1;
  uVar65 = uVar65 - 8;
  lVar38 = lVar38 + -8;
  goto LAB_01f3a9c6;
code_r0x01f3a814:
  uVar43 = uVar43 - 8;
  lVar38 = lVar38 + 8;
  goto LAB_01f3a800;
code_r0x01f3a611:
  puVar58 = puVar58 + 1;
  puVar32 = puVar32 + 1;
  uVar65 = uVar65 - 8;
  lVar42 = lVar42 + -8;
  goto LAB_01f3a5ff;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}